

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O1

void __thiscall
LowererMD::EmitReinterpretFloatToInt(LowererMD *this,Opnd *dst,Opnd *src,Instr *insertBeforeInstr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((dst->m_type | TyInt64) != TyUint32) {
    bVar2 = IRType_IsInt64(dst->m_type);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x1df3,"(dst->IsInt32() || dst->IsUInt32() || dst->IsInt64())",
                         "dst->IsInt32() || dst->IsUInt32() || dst->IsInt64()");
      if (!bVar2) goto LAB_0066976e;
      *puVar3 = 0;
    }
  }
  if (1 < (byte)(src->m_type - TyFloat32)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x1df4,"(src->IsFloat())","src->IsFloat()");
    if (!bVar2) {
LAB_0066976e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  EmitReinterpretPrimitive(this,dst,src,insertBeforeInstr);
  return;
}

Assistant:

void LowererMD::EmitReinterpretFloatToInt(IR::Opnd* dst, IR::Opnd* src, IR::Instr* insertBeforeInstr)
{
    Assert(dst->IsInt32() || dst->IsUInt32() || dst->IsInt64());
    Assert(src->IsFloat());
    EmitReinterpretPrimitive(dst, src, insertBeforeInstr);
}